

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O3

void dbgpbval(dbgcxdef *ctx,dattyp typ,uchar *val,_func_void_void_ptr_char_ptr_int *dispfn,
             void *dispctx)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  uint val_00;
  char *pcVar4;
  char buf [40];
  uint local_5c;
  uchar *local_58 [5];
  
  switch(typ) {
  case 1:
    sprintf((char *)local_58,"%ld",(long)*(int *)val);
    sVar3 = strlen((char *)local_58);
    iVar2 = (int)sVar3;
    goto LAB_00121931;
  case 2:
    val_00 = (uint)*(ushort *)val;
    iVar2 = 2;
    break;
  case 3:
    uVar1 = *(ushort *)val;
    (*dispfn)(dispctx,"\'",1);
    if (uVar1 - 2 != 0) {
      (*dispfn)(dispctx,(char *)(val + 2),uVar1 - 2);
    }
    (*dispfn)(dispctx,"\'",1);
    return;
  default:
    iVar2 = 0xe;
    pcVar4 = "[unknown type]";
    goto LAB_001219a5;
  case 5:
    iVar2 = 3;
    pcVar4 = "nil";
    goto LAB_001219a5;
  case 7:
    (*dispfn)(dispctx,"[",1);
    local_58[0] = val + 2;
    local_5c = *(ushort *)val - 2;
    if (local_5c != 0) {
      do {
        dbgpbval(ctx,(int)(char)*local_58[0],local_58[0] + 1,dispfn,dispctx);
        lstadv(local_58,&local_5c);
        if (local_5c == 0) break;
        (*dispfn)(dispctx," ",1);
      } while (local_5c != 0);
    }
    (*dispfn)(dispctx,"]",1);
    return;
  case 8:
    iVar2 = 4;
    pcVar4 = "true";
LAB_001219a5:
    (*dispfn)(dispctx,pcVar4,iVar2);
    return;
  case 10:
    (*dispfn)(dispctx,"&",1);
    val_00 = (uint)*(ushort *)val;
    iVar2 = 1;
    break;
  case 0xd:
    (*dispfn)(dispctx,"&",1);
    val_00 = (uint)*(ushort *)val;
    iVar2 = 3;
  }
  iVar2 = dbgnam(ctx,(char *)local_58,iVar2,val_00);
LAB_00121931:
  if (iVar2 != 0) {
    (*dispfn)(dispctx,(char *)local_58,iVar2);
  }
  return;
}

Assistant:

static void dbgpbval(dbgcxdef *ctx, dattyp typ, uchar *val,
                     void (*dispfn)(void *, const char *, int),
                     void *dispctx)
{
    char  buf[TOKNAMMAX + 1];
    char *p = buf;
    uint  len;

    switch(typ)
    {
    case DAT_NUMBER:
        sprintf(buf, "%ld", (long)osrp4s(val));
        len = strlen(buf);
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, buf, TOKSTOBJ, osrp2(val));
        break;
        
    case DAT_SSTRING:
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        break;
        
    case DAT_NIL:
        p = "nil";
        len = 3;
        break;

    case DAT_LIST:
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv((uchar **)&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTFUNC, osrp2(val));
        break;
        
    case DAT_PROPNUM:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTPROP, osrp2(val));
        break;
        
    default:
        p = "[unknown type]";
        len = 14;
        break;
    }

    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
    if (len) (*dispfn)(dispctx, p, len);
    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
}